

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_69;
  REF_STATUS ref_private_macro_code_rss_68;
  REF_STATUS ref_private_macro_code_rss_67;
  REF_STATUS ref_private_macro_code_rss_66;
  REF_STATUS ref_private_macro_code_rss_65;
  REF_STATUS ref_private_macro_code_rss_64;
  REF_STATUS ref_private_macro_code_rss_63;
  REF_STATUS ref_private_macro_code_rss_62;
  REF_STATUS ref_private_macro_code_rss_61;
  REF_STATUS ref_private_macro_code_rss_60;
  REF_STATUS ref_private_macro_code_rss_59;
  REF_STATUS ref_private_macro_code_rss_58;
  REF_STATUS ref_private_macro_code_rss_57;
  REF_STATUS ref_private_macro_code_rss_56;
  REF_STATUS ref_private_macro_code_rss_55;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT edge20;
  REF_INT edge12;
  REF_INT edge01;
  REF_INT *marked_for_removal;
  REF_INT local_128;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_b4;
  REF_INT nodes [27];
  REF_CELL local_40;
  REF_CELL qua_split;
  REF_CELL tri_split;
  REF_CELL qua;
  REF_CELL tri;
  REF_SUBDIV pRStack_18;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  qua = ref_subdiv->grid->cell[3];
  pRStack_18 = ref_subdiv;
  if (qua->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x476,
           "ref_subdiv_split_tri","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    _edge12 = malloc((long)qua->max << 2);
    if (_edge12 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x476,"ref_subdiv_split_tri","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < qua->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)_edge12 + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar1 = ref_cell_create(&qua_split,qua->type);
      if (uVar1 == 0) {
        tri_split = pRStack_18->grid->cell[6];
        uVar1 = ref_cell_create(&local_40,tri_split->type);
        if (uVar1 == 0) {
          for (tri._4_4_ = 0; tri._4_4_ < qua->max; tri._4_4_ = tri._4_4_ + 1) {
            if (((-1 < tri._4_4_) && (tri._4_4_ < qua->max)) &&
               (qua->c2n[qua->size_per * tri._4_4_] != -1)) {
              uVar1 = ref_cell_nodes(qua,tri._4_4_,new_nodes + 0x1a);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x47e,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                return uVar1;
              }
              uVar1 = ref_edge_with(pRStack_18->edge,new_nodes[0x1a],local_b4,&edge20);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x480,"ref_subdiv_split_tri",(ulong)uVar1,"e01");
                return uVar1;
              }
              uVar1 = ref_edge_with(pRStack_18->edge,local_b4,nodes[0],&ref_malloc_init_i);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x482,"ref_subdiv_split_tri",(ulong)uVar1,"e12");
                return uVar1;
              }
              uVar1 = ref_edge_with(pRStack_18->edge,nodes[0],new_nodes[0x1a],
                                    &ref_private_macro_code_rss);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x484,"ref_subdiv_split_tri",(ulong)uVar1,"e20");
                return uVar1;
              }
              if (((pRStack_18->mark[edge20] == 0) || (pRStack_18->mark[ref_malloc_init_i] == 0)) ||
                 (pRStack_18->mark[ref_private_macro_code_rss] == 0)) {
                if (((pRStack_18->mark[edge20] == 0) || (pRStack_18->mark[ref_malloc_init_i] == 0))
                   || (pRStack_18->mark[ref_private_macro_code_rss] != 0)) {
                  if (((pRStack_18->mark[ref_malloc_init_i] == 0) ||
                      (pRStack_18->mark[ref_private_macro_code_rss] == 0)) ||
                     (pRStack_18->mark[edge20] != 0)) {
                    if (((pRStack_18->mark[ref_private_macro_code_rss] == 0) ||
                        (pRStack_18->mark[edge20] == 0)) ||
                       (pRStack_18->mark[ref_malloc_init_i] != 0)) {
                      if (pRStack_18->mark[edge20] != 0) {
                        *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x50b,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between
                                          (pRStack_18,new_nodes[0x1a],local_b4,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x50e,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x50f,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x510,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between
                                          (pRStack_18,new_nodes[0x1a],local_b4,&new_cell);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x513,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x514,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                      }
                      if (pRStack_18->mark[ref_malloc_init_i] != 0) {
                        *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x519,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],&new_cell);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x51c,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x51d,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x51e,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],new_nodes);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x521,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x522,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                      }
                      if (pRStack_18->mark[ref_private_macro_code_rss] != 0) {
                        *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x527,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between
                                          (pRStack_18,nodes[0],new_nodes[0x1a],new_nodes);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x52a,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x52b,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                        uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x52c,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                          return uVar1;
                        }
                        uVar1 = ref_subdiv_node_between
                                          (pRStack_18,nodes[0],new_nodes[0x1a],&local_128);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x52f,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                          return uVar1;
                        }
                        uVar1 = ref_cell_add(qua_split,&local_128,
                                             (REF_INT *)((long)&marked_for_removal + 4));
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                                 ,0x530,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                          return uVar1;
                        }
                      }
                    }
                    else {
                      *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                      uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x4f4,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                        return uVar1;
                      }
                      uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_b4,&new_cell)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x4f7,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                        return uVar1;
                      }
                      uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x4fa,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                        return uVar1;
                      }
                      uVar1 = ref_cell_add(qua_split,&local_128,
                                           (REF_INT *)((long)&marked_for_removal + 4));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x4fb,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                        return uVar1;
                      }
                      uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x4fd,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                        return uVar1;
                      }
                      new_nodes[2] = new_nodes[1];
                      uVar1 = ref_subdiv_node_between
                                        (pRStack_18,new_nodes[0x1a],local_b4,&local_128);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x501,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                        return uVar1;
                      }
                      uVar1 = ref_subdiv_node_between
                                        (pRStack_18,new_nodes[0x1a],nodes[0],new_nodes + 1);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x504,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                        return uVar1;
                      }
                      uVar1 = ref_cell_add(local_40,&local_128,
                                           (REF_INT *)((long)&marked_for_removal + 4));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x505,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                        return uVar1;
                      }
                    }
                  }
                  else {
                    *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                    uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4db,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],local_b4,&new_cell);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4de,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],&local_128);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4e1,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(qua_split,&local_128,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4e2,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                      return uVar1;
                    }
                    uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4e4,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                      return uVar1;
                    }
                    new_nodes[2] = new_nodes[1];
                    uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],local_b4,new_nodes);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4e8,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_subdiv_node_between
                                      (pRStack_18,nodes[0],new_nodes[0x1a],new_nodes + 1);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4eb,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                      return uVar1;
                    }
                    uVar1 = ref_cell_add(local_40,&local_128,
                                         (REF_INT *)((long)&marked_for_removal + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4ec,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                      return uVar1;
                    }
                  }
                }
                else {
                  *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                  uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4c1,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                    return uVar1;
                  }
                  uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],new_nodes);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4c4,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                    return uVar1;
                  }
                  uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,new_nodes[0x1a],&local_128);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4c7,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                    return uVar1;
                  }
                  uVar1 = ref_cell_add(qua_split,&local_128,
                                       (REF_INT *)((long)&marked_for_removal + 4));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4c8,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                    return uVar1;
                  }
                  uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4ca,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                    return uVar1;
                  }
                  new_nodes[2] = new_nodes[1];
                  new_nodes[1] = new_nodes[0];
                  uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],new_nodes);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4cf,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                    return uVar1;
                  }
                  uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,new_nodes[0x1a],&new_cell);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4d2,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                    return uVar1;
                  }
                  uVar1 = ref_cell_add(local_40,&local_128,
                                       (REF_INT *)((long)&marked_for_removal + 4));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4d3,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                    return uVar1;
                  }
                }
              }
              else {
                *(undefined4 *)((long)_edge12 + (long)tri._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x48b,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_b4,&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x48e,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x491,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(qua_split,&local_128,(REF_INT *)((long)&marked_for_removal + 4)
                                    );
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x492,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x495,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,new_nodes[0x1a],&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x498,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49b,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(qua_split,&local_128,(REF_INT *)((long)&marked_for_removal + 4)
                                    );
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49c,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49f,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],local_b4,&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a2,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a5,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(qua_split,&local_128,(REF_INT *)((long)&marked_for_removal + 4)
                                    );
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a6,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(qua,tri._4_4_,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a9,"ref_subdiv_split_tri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_b4,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4ac,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_b4,nodes[0],&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4af,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4b2,"ref_subdiv_split_tri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(qua_split,&local_128,(REF_INT *)((long)&marked_for_removal + 4)
                                    );
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4b3,"ref_subdiv_split_tri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
            }
          }
          for (tri._4_4_ = 0; tri._4_4_ < qua->max; tri._4_4_ = tri._4_4_ + 1) {
            if ((*(int *)((long)_edge12 + (long)tri._4_4_ * 4) == 1) &&
               (uVar1 = ref_cell_remove(qua,tri._4_4_), uVar1 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x536,"ref_subdiv_split_tri",(ulong)uVar1,"remove");
              return uVar1;
            }
          }
          for (tri._4_4_ = 0; tri._4_4_ < qua_split->max; tri._4_4_ = tri._4_4_ + 1) {
            RVar2 = ref_cell_nodes(qua_split,tri._4_4_,new_nodes + 0x1a);
            if ((RVar2 == 0) &&
               (uVar1 = ref_subdiv_add_local_cell(pRStack_18,qua,new_nodes + 0x1a), uVar1 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x539,"ref_subdiv_split_tri",(ulong)uVar1,"add local");
              return uVar1;
            }
          }
          for (tri._4_4_ = 0; tri._4_4_ < local_40->max; tri._4_4_ = tri._4_4_ + 1) {
            RVar2 = ref_cell_nodes(local_40,tri._4_4_,new_nodes + 0x1a);
            if ((RVar2 == 0) &&
               (uVar1 = ref_subdiv_add_local_cell(pRStack_18,tri_split,new_nodes + 0x1a), uVar1 != 0
               )) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x53c,"ref_subdiv_split_tri",(ulong)uVar1,"add local");
              return uVar1;
            }
          }
          uVar1 = ref_cell_free(qua_split);
          if (uVar1 == 0) {
            uVar1 = ref_cell_free(local_40);
            if (uVar1 == 0) {
              free(_edge12);
              ref_subdiv_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x53f,"ref_subdiv_split_tri",(ulong)uVar1,"temp qua free");
              ref_subdiv_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x53e,"ref_subdiv_split_tri",(ulong)uVar1,"temp tri free");
            ref_subdiv_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x47b,"ref_subdiv_split_tri",(ulong)uVar1,"temp qua");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x478,"ref_subdiv_split_tri",(ulong)uVar1,"temp tri");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL tri, qua;
  REF_CELL tri_split, qua_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge20;

  tri = ref_grid_tri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(tri), REF_INT, 0);

  RSS(ref_cell_create(&tri_split, ref_cell_type(tri)), "temp tri");

  qua = ref_grid_qua(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&qua_split, ref_cell_type(qua)), "temp qua");

  each_ref_cell_valid_cell(tri, cell) {
    RSS(ref_cell_nodes(tri, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[0], &edge20),
        "e20");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      /* near node 0 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 1 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 2 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* center */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      continue;
    }

    /*
      2   3-2
      |\  | |
      0-1 0-1
     */

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        !ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      new_nodes[3] = new_nodes[2]; /* last node */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20) &&
        !ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge20) &&
        ref_subdiv_mark(ref_subdiv, edge01) &&
        !ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(tri); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(tri, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(tri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(qua_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, qua, nodes), "add local");

  RSS(ref_cell_free(tri_split), "temp tri free");
  RSS(ref_cell_free(qua_split), "temp qua free");

  free(marked_for_removal);

  return REF_SUCCESS;
}